

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::UnionInPlace
          (CharSetLeaf *this,ArenaAllocator *allocator,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  CharSetLeaf *otherLeaf;
  CharSetNode *other_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetLeaf *this_local;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2f9,"(level == 0)","level == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((other == (CharSetNode *)0x0) ||
     (uVar3 = (*other->_vptr_CharSetNode[0xd])(), (uVar3 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2fa,"(other != nullptr && other->IsLeaf())",
                       "other != nullptr && other->IsLeaf()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = CharBitvec::UnionInPlaceFullCheck(&this->vec,(CharBitvec *)(other + 1));
  this_local = this;
  if (bVar2) {
    FreeSelf(this,allocator);
    this_local = (CharSetLeaf *)&CharSetFull::Instance;
  }
  return &this_local->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::UnionInPlace(ArenaAllocator* allocator, uint level, const CharSetNode* other)
    {
        Assert(level == 0);
        Assert(other != nullptr && other->IsLeaf());
        CharSetLeaf* otherLeaf = (CharSetLeaf*)other;
        if (vec.UnionInPlaceFullCheck(otherLeaf->vec))
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }